

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_build_forward_expand(ggml_cgraph *cgraph,ggml_tensor *tensor)

{
  undefined8 in_RSI;
  ggml_tensor *in_RDI;
  ggml_cgraph *unaff_retaddr;
  
  ggml_build_forward_impl(unaff_retaddr,in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  return;
}

Assistant:

void ggml_build_forward_expand(struct ggml_cgraph * cgraph, struct ggml_tensor * tensor) {
    ggml_build_forward_impl(cgraph, tensor, true);
}